

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_fortify_weapon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  OBJ_APPLY_DATA *pOVar5;
  OBJ_APPLY_DATA *pOVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *format;
  
  if (*(short *)((long)vo + 0x98) != 5) {
    pcVar9 = "You can only cast this on weapons.\n\r";
LAB_00319f87:
    send_to_char(pcVar9,ch);
    return;
  }
  bVar2 = is_metal((OBJ_DATA *)vo);
  if (!bVar2) {
    pcVar9 = "You can only fortify metallic weapons.\n\r";
    goto LAB_00319f87;
  }
  bVar2 = is_worn((OBJ_DATA *)vo);
  if (bVar2) {
    pcVar9 = "You must remove it to enchant it.\n\r";
    goto LAB_00319f87;
  }
  iVar7 = ~*(uint *)((long)vo + 0x124) * *(int *)((long)vo + 0x120) + level;
  sVar3 = *(short *)(*(long *)((long)vo + 0x50) + 0xce);
  iVar4 = iVar7 * 4 + 0x32;
  if (sVar3 == 0) {
    iVar4 = iVar7 * 4 + 0x46;
  }
  iVar7 = iVar4 + -0x32;
  if (1 < (ushort)(sVar3 - 1U)) {
    iVar7 = iVar4;
  }
  if ((ushort)(sVar3 - 3U) < 0x12) {
    iVar7 = iVar7 - (int)((double)(int)sVar3 * -2.5 + 50.0);
  }
  iVar4 = number_percent();
  iVar7 = iVar7 - iVar4;
  bVar1 = true;
  bVar2 = true;
  if (iVar7 < 0x33) {
    if (iVar7 < 1) {
      if (iVar7 < -0x18) goto LAB_0031a277;
      act("Your magic fails to take hold on $p.",ch,vo,(void *)0x0,3);
      pcVar9 = "$p hums very briefly in $n\'s hands.";
      goto LAB_0031a329;
    }
    iVar4 = number_percent();
    bVar1 = 0x32 < iVar4;
    bVar2 = iVar4 < 0x33;
  }
  if (bVar2) {
    iVar4 = 0;
    for (pOVar5 = *(OBJ_APPLY_DATA **)((long)vo + 0x38); pOVar5 != (OBJ_APPLY_DATA *)0x0;
        pOVar5 = pOVar5->next) {
      if ((pOVar5->location == 0x12) && (pOVar5->type == sn)) {
        iVar4 = (int)pOVar5->modifier;
        break;
      }
    }
    if (pOVar5 == (OBJ_APPLY_DATA *)0x0) {
      pOVar5 = new_apply_data();
      pOVar5->type = (short)sn;
      pOVar5->location = 0x12;
      pOVar5->modifier = 0;
      pOVar5->next = *(OBJ_APPLY_DATA **)((long)vo + 0x38);
      *(OBJ_APPLY_DATA **)((long)vo + 0x38) = pOVar5;
    }
  }
  else {
    pOVar5 = (OBJ_APPLY_DATA *)0x0;
    iVar4 = 0;
  }
  iVar7 = 0;
  if (bVar1) {
    iVar7 = 0;
    for (pOVar6 = *(OBJ_APPLY_DATA **)((long)vo + 0x38); pOVar6 != (OBJ_APPLY_DATA *)0x0;
        pOVar6 = pOVar6->next) {
      if ((pOVar6->location == 0x13) && (pOVar6->type == sn)) {
        iVar7 = (int)pOVar6->modifier;
        break;
      }
    }
    if (pOVar6 == (OBJ_APPLY_DATA *)0x0) {
      pOVar6 = new_apply_data();
      pOVar6->type = (short)sn;
      pOVar6->location = 0x13;
      pOVar6->modifier = 0;
      pOVar6->next = *(OBJ_APPLY_DATA **)((long)vo + 0x38);
      *(OBJ_APPLY_DATA **)((long)vo + 0x38) = pOVar6;
    }
  }
  else {
    pOVar6 = (OBJ_APPLY_DATA *)0x0;
  }
  iVar8 = 0x50;
  if (!bVar2) {
    iVar8 = 0x32;
  }
  if (!bVar1) {
    iVar8 = 0x32;
  }
  iVar8 = (iVar8 - (int)((double)(iVar7 + iVar4) * 7.5)) +
          (level - *(int *)((long)vo + 0x120) * *(int *)((long)vo + 0x124)) * 4;
  if (10 < iVar4) {
    iVar8 = 2;
  }
  if (10 < iVar7) {
    iVar8 = 2;
  }
  if (bVar2) {
    iVar4 = number_percent();
    if (iVar4 < iVar8) {
      format = "$p rings with a light piercing tone as $n\'s magic works upon it.";
      pcVar9 = "You feel $p\'s balance improve in your hands as it is infused with magic.";
      sVar3 = 1;
    }
    else {
      iVar4 = number_percent();
      if (iVar8 < iVar4) goto LAB_0031a277;
      format = "$p emits a discordant tone as $n\'s magic works upon it.";
      pcVar9 = "You feel $p twist in your hands as the magic goes awry.";
      sVar3 = -1;
    }
    pOVar5->modifier = pOVar5->modifier + sVar3;
    act(pcVar9,ch,vo,(void *)0x0,3);
    act(format,ch,vo,(void *)0x0,0);
  }
  if (!bVar1) {
    return;
  }
  iVar4 = number_percent();
  if (iVar4 < iVar8) {
    pOVar6->modifier = pOVar6->modifier + 1;
    act("You feel $p grow sturdier in your hands as it is infused with magic.",ch,vo,(void *)0x0,3);
    pcVar9 = "$p flickers with a cerulean glow as $n\'s magic works upon it.";
  }
  else {
    iVar4 = number_percent();
    if (iVar8 < iVar4) {
LAB_0031a277:
      act("$p shudders and explodes in your hands!",ch,vo,(void *)0x0,3);
      act("$p shudders and explodes in $n\'s hands!",ch,vo,(void *)0x0,0);
      iVar4 = dice((int)*(short *)((long)vo + 0x108),5);
      damage_new(ch,ch,iVar4,-1,0xb,true,false,0,1,"the explosion*");
      extract_obj((OBJ_DATA *)vo);
      return;
    }
    pOVar6->modifier = pOVar6->modifier + -1;
    act("You feel $p grow frail in your hands as the magic goes awry.",ch,vo,(void *)0x0,3);
    pcVar9 = "$p flickers with a crimson glow as $n\'s magic works upon it.";
  }
LAB_0031a329:
  act(pcVar9,ch,vo,(void *)0x0,0);
  return;
}

Assistant:

void spell_fortify_weapon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *weapon = (OBJ_DATA *)vo;
	OBJ_APPLY_DATA *hitapp = nullptr, *damapp = nullptr;
	bool damfound = false, hitfound = false;
	bool dambonus = false, hitbonus = false;
	int chance = 50, diff, oldhit = 0, olddam = 0;

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only cast this on weapons.\n\r", ch);
		return;
	}

	if (!is_metal(weapon))
	{
		send_to_char("You can only fortify metallic weapons.\n\r", ch);
		return;
	}

	if (is_worn(weapon))
	{
		send_to_char("You must remove it to enchant it.\n\r", ch);
		return;
	}

	chance += (4 * (level - ((1 + weapon->value[2]) * weapon->value[1])));

	if (weapon->pIndexData->limtotal == 0)
		chance += 20;

	if (weapon->pIndexData->limtotal == 1 || weapon->pIndexData->limtotal == 2)
		chance -= 50;

	if (weapon->pIndexData->limtotal >= 3 && weapon->pIndexData->limtotal <= 20)
		chance -= (int)(50 - (2.5 * (float)weapon->pIndexData->limtotal));

	diff = chance - number_percent();

	if (diff > 50)
	{
		hitbonus = true;
		dambonus = true;
	}
	else if (diff > 0)
	{
		if (number_percent() > 50)
			dambonus = true;
		else
			hitbonus = true;
	}
	else if (diff > -25)
	{
		act("Your magic fails to take hold on $p.", ch, weapon, 0, TO_CHAR);
		act("$p hums very briefly in $n's hands.", ch, weapon, 0, TO_ROOM);
		return;
	}
	else
	{
		act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
		act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
		damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
		extract_obj(weapon);
		return;
	}

	if (hitbonus)
	{
		for (hitapp = weapon->apply; hitapp; hitapp = hitapp->next)
		{
			if (hitapp->location == APPLY_HITROLL && hitapp->type == sn)
			{
				hitfound = true;
				oldhit = hitapp->modifier;
				break;
			}
		}

		if (!hitfound)
		{
			hitapp = new_apply_data();
			hitapp->type = sn;
			hitapp->location = APPLY_HITROLL;
			hitapp->modifier = 0;
			hitapp->next = weapon->apply;
			weapon->apply = hitapp;
		}
	}

	if (dambonus)
	{
		for (damapp = weapon->apply; damapp; damapp = damapp->next)
		{
			if (damapp->location == APPLY_DAMROLL && damapp->type == sn)
			{
				damfound = true;
				olddam = damapp->modifier;
				break;
			}
		}

		if (!damfound)
		{
			damapp = new_apply_data();
			damapp->type = sn;
			damapp->location = APPLY_DAMROLL;
			damapp->modifier = 0;
			damapp->next = weapon->apply;
			weapon->apply = damapp;
		}
	}

	chance = 50;
	chance -= (int)(7.5 * (olddam + oldhit));
	chance += 4 * (level - ((weapon->value[2]) * weapon->value[1]));

	if (hitbonus && dambonus)
		chance += 30;

	if (olddam > 10 || oldhit > 10)
		chance = 2;

	if (hitbonus)
	{
		if (number_percent() < chance)
		{
			hitapp->modifier += 1;
			act("You feel $p's balance improve in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p rings with a light piercing tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				hitapp->modifier -= 1;
				act("You feel $p twist in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p emits a discordant tone as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}

	if (dambonus)
	{
		if (number_percent() < chance)
		{
			damapp->modifier += 1;
			act("You feel $p grow sturdier in your hands as it is infused with magic.", ch, weapon, 0, TO_CHAR);
			act("$p flickers with a cerulean glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
		}
		else
		{
			if (number_percent() > chance)
			{
				act("$p shudders and explodes in your hands!", ch, weapon, 0, TO_CHAR);
				act("$p shudders and explodes in $n's hands!", ch, weapon, 0, TO_ROOM);
				damage_new(ch, ch, dice(weapon->level, 5), TYPE_UNDEFINED, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the explosion*");
				extract_obj(weapon);
				return;
			}
			else
			{
				damapp->modifier -= 1;
				act("You feel $p grow frail in your hands as the magic goes awry.", ch, weapon, 0, TO_CHAR);
				act("$p flickers with a crimson glow as $n's magic works upon it.", ch, weapon, 0, TO_ROOM);
			}
		}
	}
}